

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O2

void __thiscall n_e_s::nes::Nes::Nes(Nes *this)

{
  CpuRegisters *pCVar1;
  IMmu *in_stack_ffffffffffffffb8;
  PpuRegisters *in_stack_ffffffffffffffc0;
  
  core::MmuFactory::create_empty();
  std::make_unique<n_e_s::core::PpuRegisters>();
  core::PpuFactory::create(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  core::MmuFactory::create_empty();
  std::make_unique<n_e_s::core::CpuRegisters>();
  core::CpuFactory::create_mos6502
            ((CpuFactory *)&this->cpu_,
             (this->cpu_registers_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::CpuRegisters_*,_std::default_delete<n_e_s::core::CpuRegisters>_>
             .super__Head_base<0UL,_n_e_s::core::CpuRegisters_*,_false>._M_head_impl,
             (this->mmu_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
             super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl,
             (this->ppu_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
             super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl);
  (this->rom_)._M_t.
  super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
  super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl = (IRom *)0x0;
  core::NesControllerFactory::create_nes_controller();
  core::NesControllerFactory::create_nes_controller();
  this->cycle_ = 0;
  pCVar1 = (this->cpu_registers_)._M_t.
           super___uniq_ptr_impl<n_e_s::core::CpuRegisters,_std::default_delete<n_e_s::core::CpuRegisters>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::CpuRegisters_*,_std::default_delete<n_e_s::core::CpuRegisters>_>
           .super__Head_base<0UL,_n_e_s::core::CpuRegisters_*,_false>._M_head_impl;
  pCVar1->p = '$';
  pCVar1->sp = 0xfd;
  pCVar1->a = '\0';
  pCVar1->x = '\0';
  pCVar1->y = '\0';
  return;
}

Assistant:

Nes::Nes()
        : ppu_mmu_(MmuFactory::create_empty()),
          ppu_registers_(std::make_unique<n_e_s::core::PpuRegisters>()),
          ppu_(PpuFactory::create(ppu_registers_.get(), ppu_mmu_.get())),
          mmu_(MmuFactory::create_empty()),
          cpu_registers_(std::make_unique<n_e_s::core::CpuRegisters>()),
          cpu_(CpuFactory::create_mos6502(cpu_registers_.get(),
                  mmu_.get(),
                  ppu_.get())),
          controller1_(NesControllerFactory::create_nes_controller()),
          controller2_(NesControllerFactory::create_nes_controller()) {
    // P should be set to 0x34 according to the information here:
    // https://wiki.nesdev.com/w/index.php/CPU_power_up_state
    // However, nestest sets p to 0x24 instead. We do that for now as well.
    cpu_registers_->p = I_FLAG | FLAG_5;
    cpu_registers_->a = cpu_registers_->x = cpu_registers_->y = 0x00;
    cpu_registers_->sp = 0xFD;
}